

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void process_init_field_designator
               (c2m_ctx_t c2m_ctx,node_t_conflict designator_member,type *container_type)

{
  node_t_conflict obj;
  init_object_t obj_00;
  init_object_t obj_01;
  type *ptVar1;
  size_t sVar2;
  anon_union_8_2_e4b0c9a5_for_u aVar3;
  void *pvVar4;
  init_object_t local_58;
  init_object_t local_40;
  
  if (designator_member->code != N_MEMBER) {
    __assert_fail("designator_member->code == N_MEMBER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1daa,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
  }
  while( true ) {
    sVar2 = VARR_init_object_tlength(c2m_ctx->init_object_path);
    if (sVar2 == 0) break;
    VARR_init_object_tlast(&local_58,c2m_ctx->init_object_path);
    ptVar1 = local_58.container_type;
    if (((local_58.field_designator_p == 0) || ((local_58.u.curr_member)->attr == (void *)0x0)) ||
       (*(char *)(*(long *)((long)(local_58.u.curr_member)->attr + 0x40) + 0x1d) == '\0')) break;
    VARR_init_object_tpop(&local_40,c2m_ctx->init_object_path);
    container_type = ptVar1;
  }
  sVar2 = VARR_node_tlength(c2m_ctx->containing_anon_members);
  if (sVar2 == 0) {
    pvVar4 = designator_member->attr;
    while (obj = *(node_t_conflict *)((long)pvVar4 + 0x48), obj != (node_t_conflict)0x0) {
      pvVar4 = obj->attr;
      VARR_node_tpush(c2m_ctx->containing_anon_members,obj);
    }
    while( true ) {
      sVar2 = VARR_node_tlength(c2m_ctx->containing_anon_members);
      if (sVar2 == 0) break;
      aVar3.curr_member = VARR_node_tpop(c2m_ctx->containing_anon_members);
      local_58.field_designator_p = 0;
      obj_00._8_8_ = (ulong)(uint)local_58._12_4_ << 0x20;
      obj_00.container_type = container_type;
      obj_00.u.curr_index = aVar3.curr_index;
      local_58.container_type = container_type;
      local_58.u.curr_member = aVar3.curr_member;
      VARR_init_object_tpush(c2m_ctx->init_object_path,obj_00);
      container_type = *(type **)((long)(aVar3.curr_member)->attr + 0x40);
    }
    local_58.u.curr_member = get_adjacent_member(designator_member,0);
    local_58.field_designator_p = 1;
    obj_01._12_4_ = local_58._12_4_;
    obj_01.field_designator_p = 1;
    obj_01.container_type = container_type;
    obj_01.u.curr_index = local_58.u.curr_index;
    local_58.container_type = container_type;
    VARR_init_object_tpush(c2m_ctx->init_object_path,obj_01);
    return;
  }
  __assert_fail("VARR_LENGTH (node_t, containing_anon_members) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1db6,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
}

Assistant:

static void process_init_field_designator (c2m_ctx_t c2m_ctx, node_t designator_member,
                                           struct type *container_type) {
  decl_t decl;
  init_object_t init_object;
  node_t curr_member;

  assert (designator_member->code == N_MEMBER);
  /* We can have *partial* path of containing anon members: pop them */
  while (VARR_LENGTH (init_object_t, init_object_path) != 0) {
    init_object = VARR_LAST (init_object_t, init_object_path);
    if (!init_object.field_designator_p || (decl = init_object.u.curr_member->attr) == NULL
        || !decl->decl_spec.type->unnamed_anon_struct_union_member_type_p) {
      break;
    }
    container_type = init_object.container_type;
    VARR_POP (init_object_t, init_object_path);
  }
  /* Now add *full* path to designator_member of containing anon members */
  assert (VARR_LENGTH (node_t, containing_anon_members) == 0);
  decl = designator_member->attr;
  for (curr_member = decl->containing_unnamed_anon_struct_union_member; curr_member != NULL;
       curr_member = decl->containing_unnamed_anon_struct_union_member) {
    decl = curr_member->attr;
    VARR_PUSH (node_t, containing_anon_members, curr_member);
  }
  while (VARR_LENGTH (node_t, containing_anon_members) != 0) {
    init_object.u.curr_member = VARR_POP (node_t, containing_anon_members);
    init_object.container_type = container_type;
    init_object.field_designator_p = FALSE;
    VARR_PUSH (init_object_t, init_object_path, init_object);
    container_type = (decl = init_object.u.curr_member->attr)->decl_spec.type;
  }
  init_object.u.curr_member = get_adjacent_member (designator_member, FALSE);
  init_object.container_type = container_type;
  init_object.field_designator_p = TRUE;
  VARR_PUSH (init_object_t, init_object_path, init_object);
}